

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O2

void Eigen::HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_compute
               (MatrixType *matA,CoeffVectorType *hCoeffs,VectorType *temp)

{
  long n;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  VectorType *pVVar1;
  long i;
  long lVar2;
  Scalar h;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_148;
  CoeffVectorType *local_140;
  VectorType *local_138;
  long local_130;
  RealScalar local_128;
  long local_120;
  Scalar local_118;
  RealScalar beta;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> local_108 [56];
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> local_d0 [56];
  Type local_98;
  
  lVar2 = (matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  local_148 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matA;
  local_140 = hCoeffs;
  if (lVar2 == (matA->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols) {
    local_138 = temp;
    PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&temp->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,lVar2);
    this = local_148;
    local_130 = 1;
    if (1 < lVar2) {
      local_130 = lVar2;
    }
    local_130 = local_130 + -1;
    lVar2 = lVar2 + -2;
    i = 0;
    while (local_130 != i) {
      n = lVar2 + 1;
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_d0,
                 (Matrix<double,__1,__1,_0,__1,__1> *)this,i);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 local_d0,n);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::makeHouseholderInPlace
                ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                  *)&local_98,&h,&beta);
      local_128 = beta;
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_98,
                 (Matrix<double,__1,__1,_0,__1,__1> *)this,i);
      local_120 = i + 1;
      local_98.
      super_Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
      .
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
      .m_data[i + 1] = local_128;
      (local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [i] = h;
      DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                ((Type *)local_d0,this,n,n);
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_108,
                 (Matrix<double,__1,__1,_0,__1,__1> *)this,i);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_98,local_108,lVar2);
      pVVar1 = local_138;
      MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
      applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                (local_d0,&local_98,&h,
                 (local_138->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                 m_storage.m_data);
      DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rightCols<long>((Type *)local_d0,this,n)
      ;
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_108,
                 (Matrix<double,__1,__1,_0,__1,__1> *)this,i);
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_98,local_108,lVar2);
      local_118 = h;
      MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>>::
      applyHouseholderOnTheRight<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>> *)
                 local_d0,&local_98,&local_118,
                 (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
                 m_data);
      lVar2 = lVar2 + -1;
      i = local_120;
    }
    return;
  }
  __assert_fail("matA.rows()==matA.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Eigenvalues/./HessenbergDecomposition.h"
                ,0x128,
                "static void Eigen::HessenbergDecomposition<Eigen::Matrix<double, -1, -1>>::_compute(MatrixType &, CoeffVectorType &, VectorType &) [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void HessenbergDecomposition<MatrixType>::_compute(MatrixType& matA, CoeffVectorType& hCoeffs, VectorType& temp)
{
  eigen_assert(matA.rows()==matA.cols());
  Index n = matA.rows();
  temp.resize(n);
  for (Index i = 0; i<n-1; ++i)
  {
    // let's consider the vector v = i-th column starting at position i+1
    Index remainingSize = n-i-1;
    RealScalar beta;
    Scalar h;
    matA.col(i).tail(remainingSize).makeHouseholderInPlace(h, beta);
    matA.col(i).coeffRef(i+1) = beta;
    hCoeffs.coeffRef(i) = h;

    // Apply similarity transformation to remaining columns,
    // i.e., compute A = H A H'

    // A = H A
    matA.bottomRightCorner(remainingSize, remainingSize)
        .applyHouseholderOnTheLeft(matA.col(i).tail(remainingSize-1), h, &temp.coeffRef(0));

    // A = A H'
    matA.rightCols(remainingSize)
        .applyHouseholderOnTheRight(matA.col(i).tail(remainingSize-1), numext::conj(h), &temp.coeffRef(0));
  }
}